

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::BasicSharedSimple::RunIteration
          (BasicSharedSimple *this,GLuint num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  uint uVar1;
  GLuint GVar2;
  ulong __n;
  ulong uVar3;
  bool bVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  GLuint groups [3];
  allocator_type local_61;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  value_type_conflict4 local_44;
  undefined1 *local_40;
  GLuint *local_38;
  
  __n = (ulong)(num_groups << 8);
  local_44 = 0xffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_60,__n,&local_44,&local_61);
  local_38 = &this->m_storage_buffer;
  GVar2 = this->m_storage_buffer;
  if (GVar2 == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,local_38);
    GVar2 = *local_38;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar2);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,__n * 4,
             local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect) {
    local_40 = &DAT_100000001;
    GVar2 = this->m_dispatch_buffer;
    local_44 = num_groups;
    if (GVar2 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      GVar2 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar2);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&local_44,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(this_00,num_groups,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*local_38);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData
            (this_00,0x90d2,0,__n * 4,
             local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (num_groups == 0) {
    bVar4 = true;
  }
  else {
    uVar1 = *local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    bVar4 = false;
    if (uVar1 == 1) {
      uVar3 = 0;
      do {
        if (__n - 1 == uVar3) {
          bVar4 = true;
          goto LAB_0091981d;
        }
        uVar1 = local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3 + 1];
        uVar3 = uVar3 + 1;
      } while (uVar1 == 1);
      bVar4 = __n <= uVar3;
    }
    anon_unknown_0::Output("Data at index %d is %d should be %d.\n",uVar3,(ulong)uVar1,1);
  }
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
LAB_0091981d:
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool RunIteration(const GLuint num_groups, bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256 * num_groups;

		std::vector<GLuint> data(kBufferSize, 0xffff);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { num_groups, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, &data[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (data[i] != 1)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], 1);
				return false;
			}
		}
		return true;
	}